

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void funnelsort_Kway<64u,buffer_layout_bfs>(uchar **strings,size_t n)

{
  byte *pbVar1;
  byte *pbVar2;
  size_t n_00;
  uchar *__s1;
  int iVar3;
  uchar **tmp;
  uchar **ppuVar4;
  uchar **ppuVar5;
  size_t num;
  unsigned_long uVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  uchar *__s2;
  size_t num_1;
  unsigned_long uVar10;
  array<Stream,_64UL> streams;
  array<unsigned_char_*,_5068UL> buffers;
  fill<64U,_2U,_buffer_layout_bfs> local_a4b1;
  uchar **local_a4b0;
  size_t local_a4a8;
  size_t local_a4a0;
  uchar **local_a498;
  array<unsigned_long,_64UL> local_a490;
  array<Stream,_64UL> local_a290;
  uchar *local_9e90 [8];
  undefined8 local_9e50 [8];
  undefined1 auStack_9e10 [40416];
  
  tmp = (uchar **)malloc(n * 8);
  if (n < 0x20) {
    ppuVar4 = strings;
    if (1 < n) {
      do {
        pbVar1 = ppuVar4[1];
        for (ppuVar5 = ppuVar4 + 1; strings < ppuVar5; ppuVar5 = ppuVar5 + -1) {
          pbVar2 = ppuVar5[-1];
          bVar7 = *pbVar2;
          bVar8 = *pbVar1;
          if (bVar7 != 0 && bVar7 == bVar8) {
            lVar9 = 1;
            do {
              bVar7 = pbVar2[lVar9];
              bVar8 = pbVar1[lVar9];
              if (bVar7 == 0) break;
              lVar9 = lVar9 + 1;
            } while (bVar7 == bVar8);
          }
          if (bVar7 <= bVar8) break;
          *ppuVar5 = pbVar2;
        }
        iVar3 = (int)n;
        *ppuVar5 = pbVar1;
        n = (size_t)(iVar3 - 1);
        ppuVar4 = ppuVar4 + 1;
      } while (2 < iVar3);
    }
  }
  else {
    local_a290._M_elems[0].n = n >> 6;
    local_a290._M_elems[0].stream = strings;
    ppuVar4 = strings + local_a290._M_elems[0].n;
    lVar9 = 0x18;
    do {
      *(uchar ***)((long)local_a290._M_elems + lVar9 + -8) = ppuVar4;
      *(size_t *)((long)&local_a290._M_elems[0].stream + lVar9) = local_a290._M_elems[0].n;
      ppuVar4 = ppuVar4 + local_a290._M_elems[0].n;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x3f8);
    local_a290._M_elems[0x3f].stream = local_a290._M_elems[0x3e].stream + local_a290._M_elems[0].n;
    local_a290._M_elems[0x3f].n = local_a290._M_elems[0].n * -0x3f + n;
    lVar9 = 8;
    local_a4b0 = strings;
    local_a4a8 = n * 8;
    local_a4a0 = n;
    do {
      ppuVar4 = *(uchar ***)((long)local_a290._M_elems + lVar9 + -8);
      n_00 = *(size_t *)((long)&local_a290._M_elems[0].stream + lVar9);
      funnelsort<16u,buffer_layout_bfs>(ppuVar4,n_00,tmp);
      check_input(ppuVar4,n_00);
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x408);
    uVar6 = 0;
    memset(&local_a490,0,0x200);
    uVar10 = 0;
    local_a498 = tmp;
    while ((uVar10 != 0 ||
           (fill<64U,_2U,_buffer_layout_bfs>::operator()
                      (&local_a4b1,&local_a290,local_9e90,&local_a490),
           uVar6 = local_a490._M_elems[3], uVar10 = local_a490._M_elems[2],
           local_a490._M_elems[2] != 0))) {
      if ((uVar6 == 0) &&
         (fill<64U,_3U,_buffer_layout_bfs>::operator()
                    ((fill<64U,_3U,_buffer_layout_bfs> *)&local_a4b1,&local_a290,local_9e90,
                     &local_a490), uVar6 = local_a490._M_elems[3], uVar10 = local_a490._M_elems[2],
         local_a490._M_elems[3] == 0)) {
        if (local_a490._M_elems[2] == 0) {
          __assert_fail("buffer_count[2] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x247,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 64U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        do {
          uVar6 = local_a490._M_elems[2];
          memcpy(tmp,local_9e50 + -local_a490._M_elems[2],local_a490._M_elems[2] * 8);
          tmp = tmp + uVar6;
          local_a490._M_elems[2] = 0;
          fill<64U,_2U,_buffer_layout_bfs>::operator()
                    (&local_a4b1,&local_a290,local_9e90,&local_a490);
        } while (local_a490._M_elems[2] != 0);
        goto LAB_00126575;
      }
      __s1 = local_9e90[8 - uVar10];
      if (__s1 == (uchar *)0x0) {
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      __s2 = (uchar *)local_9e50[8 - uVar6];
      if (__s2 == (uchar *)0x0) {
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar3 = strcmp((char *)__s1,(char *)__s2);
      if (iVar3 < 1) {
        uVar10 = uVar10 - 1;
        __s2 = __s1;
        local_a490._M_elems[2] = uVar10;
      }
      else {
        uVar6 = uVar6 - 1;
        local_a490._M_elems[3] = uVar6;
      }
      *tmp = __s2;
      tmp = tmp + 1;
    }
    if (local_a490._M_elems[3] == 0) {
      __assert_fail("buffer_count[3] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x239,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 64U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    do {
      uVar6 = local_a490._M_elems[3];
      if (local_a490._M_elems[3] * 8 != 0) {
        memcpy(tmp,auStack_9e10 + local_a490._M_elems[3] * -8,local_a490._M_elems[3] * 8);
      }
      tmp = tmp + uVar6;
      local_a490._M_elems[3] = 0;
      fill<64U,_3U,_buffer_layout_bfs>::operator()
                ((fill<64U,_3U,_buffer_layout_bfs> *)&local_a4b1,&local_a290,local_9e90,&local_a490)
      ;
    } while (local_a490._M_elems[3] != 0);
LAB_00126575:
    tmp = local_a498;
    ppuVar4 = local_a4b0;
    memcpy(local_a4b0,local_a498,local_a4a8);
    check_input(ppuVar4,local_a4a0);
  }
  free(tmp);
  return;
}

Assistant:

void funnelsort_Kway(unsigned char** strings, size_t n)
{
	unsigned char** tmp = static_cast<unsigned char**>(
			malloc(n*sizeof(unsigned char*)));
	funnelsort<K, BufferLayout>(strings, n, tmp);
	free(tmp);
}